

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O1

void __thiscall
wasm::SuffixTreeTest_TestSingleCharacterRepeat_Test::TestBody
          (SuffixTreeTest_TestSingleCharacterRepeat_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int *piVar1;
  pointer pRVar2;
  uint *puVar3;
  char *pcVar4;
  int *expected_predicate_value;
  difference_type __d;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  pointer pRVar9;
  initializer_list<unsigned_int> __l;
  void *pvStack_218;
  SuffixTree ST;
  undefined4 auStack_200 [26];
  SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode> local_198 [104];
  SuffixTreeInternalNode *local_130;
  RepeatedSubstringIterator local_110;
  void *local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> RepeatedRepetitionData;
  iterator It;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  SubStrings;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertionResult gtest_ar_;
  
  auStack_200[0] = 2;
  pvStack_218 = (void *)0x100000001;
  _ST = 1;
  __l._M_len = 7;
  __l._M_array = (iterator)&pvStack_218;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8,__l,
             (allocator_type *)
             &RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::SuffixTree::SuffixTree((SuffixTree *)&pvStack_218,(vector *)&local_c8);
  It.MinLength = 0;
  It._68_4_ = 0;
  SubStrings.
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  SubStrings.
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SuffixTree::RepeatedSubstringIterator::RepeatedSubstringIterator
            ((RepeatedSubstringIterator *)
             &RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_130);
  if (CONCAT71(RepeatedRepetitionData.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._1_7_,
               (char)RepeatedRepetitionData.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage) != 0) {
    do {
      std::
      vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
      ::push_back((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                   *)&It.MinLength,(value_type *)&It);
      SuffixTree::RepeatedSubstringIterator::operator++
                (&local_110,
                 (RepeatedSubstringIterator *)
                 &RepeatedRepetitionData.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0);
      if (local_110.InternalNodesToVisit.
          super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.InternalNodesToVisit.
                        super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_110.InternalNodesToVisit.
                              super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.InternalNodesToVisit.
                              super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_110.RS.StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.RS.StartIndices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110.RS.StartIndices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.RS.StartIndices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    } while (CONCAT71(RepeatedRepetitionData.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._1_7_,
                      (char)RepeatedRepetitionData.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) != 0);
  }
  if (It.RS.StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(It.RS.StartIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)It.InternalNodesToVisit.
                          super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)It.RS.StartIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (It.RS._0_8_ != 0) {
    operator_delete((void *)It.RS._0_8_,
                    (long)It.RS.StartIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - It.RS._0_8_);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)SubStrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_start - It._64_8_ >> 5);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)
             &RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"SubStrings.size()","1u",
             (unsigned_long *)&local_48,(uint *)&gtest_ar_.message_);
  if ((char)RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (It.N == (SuffixTreeNode *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)It.N;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
               ,0x5f,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (It.N != (SuffixTreeNode *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&It,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)It.N);
  }
  pRVar2 = SubStrings.
           super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pointer)It._64_8_ !=
      SubStrings.
      super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &gtest_ar_.message_;
    pRVar9 = (pointer)It._64_8_;
    do {
      local_48._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)(pRVar9->StartIndices).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pRVar9->StartIndices).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(((long)RepeatedRepetitionData.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start - (long)local_c8 >> 2) - (ulong)pRVar9->Length
             );
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)
                 &RepeatedRepetitionData.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,"RS.StartIndices.size()",
                 "RepeatedRepetitionData.size() - RS.Length",(unsigned_long *)&local_48,
                 (unsigned_long *)this_00);
      if ((char)RepeatedRepetitionData.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == '\0') {
        testing::Message::Message((Message *)&local_48);
        pcVar4 = "";
        if (It.N != (SuffixTreeNode *)0x0) {
          pcVar4 = *(char **)It.N;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                   ,0x62,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
        if (local_48._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_48._M_head_impl + 8))();
        }
      }
      if (It.N != (SuffixTreeNode *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&It,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            It.N);
      }
      for (puVar3 = *(uint **)(It._64_8_ + 8); puVar3 != *(uint **)(It._64_8_ + 0x10);
          puVar3 = puVar3 + 1) {
        uVar5 = (ulong)*puVar3;
        expected_predicate_value = (int *)((long)local_c8 + uVar5 * 4);
        uVar8 = (ulong)(*(int *)It._64_8_ + *puVar3);
        piVar1 = (int *)((long)local_c8 + uVar8 * 4);
        uVar8 = uVar8 * 4 + uVar5 * -4;
        lVar7 = (long)uVar8 >> 4;
        if (0 < lVar7) {
          expected_predicate_value =
               (int *)((long)expected_predicate_value + (uVar8 & 0xfffffffffffffff0));
          lVar7 = lVar7 + 1;
          piVar6 = (int *)((long)local_c8 + uVar5 * 4 + 8);
          do {
            if (piVar6[-2] != 1) {
              piVar6 = piVar6 + -2;
              goto LAB_001d15c4;
            }
            if (piVar6[-1] != 1) {
              piVar6 = piVar6 + -1;
              goto LAB_001d15c4;
            }
            if (*piVar6 != 1) goto LAB_001d15c4;
            if (piVar6[1] != 1) {
              piVar6 = piVar6 + 1;
              goto LAB_001d15c4;
            }
            lVar7 = lVar7 + -1;
            piVar6 = piVar6 + 4;
          } while (1 < lVar7);
        }
        lVar7 = (long)piVar1 - (long)expected_predicate_value >> 2;
        if (lVar7 == 1) {
LAB_001d15a7:
          piVar6 = expected_predicate_value;
          if (*expected_predicate_value == 1) {
            expected_predicate_value = piVar1;
            piVar6 = piVar1;
          }
        }
        else if (lVar7 == 2) {
LAB_001d159d:
          piVar6 = expected_predicate_value;
          if (*expected_predicate_value == 1) {
            expected_predicate_value = expected_predicate_value + 1;
            goto LAB_001d15a7;
          }
        }
        else {
          piVar6 = piVar1;
          if ((lVar7 == 3) && (piVar6 = expected_predicate_value, *expected_predicate_value == 1)) {
            expected_predicate_value = expected_predicate_value + 1;
            goto LAB_001d159d;
          }
        }
LAB_001d15c4:
        local_48._M_head_impl._1_7_ = (undefined7)((ulong)local_48._M_head_impl >> 8);
        local_48._M_head_impl._0_1_ = piVar6 == piVar1;
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        if (piVar6 != piVar1) {
          testing::Message::Message((Message *)&gtest_ar_.message_);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)
                     &RepeatedRepetitionData.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(internal *)&local_48,
                     (AssertionResult *)
                     "all_of(make_range<std::vector<unsigned>::iterator>(RRDIt, RRDIt2), [](unsigned Elt) { return Elt == 1; })"
                     ,"false","true",(char *)expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &SubStrings.
                      super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                     ,0x69,(char *)CONCAT71(RepeatedRepetitionData.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_
                                            ,(char)RepeatedRepetitionData.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           ));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &SubStrings.
                      super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (Message *)&gtest_ar_.message_);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     &SubStrings.
                      super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((RepeatedSubstring *)
              CONCAT71(RepeatedRepetitionData.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._1_7_,
                       (char)RepeatedRepetitionData.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage) != &It.RS) {
            operator_delete((undefined1 *)
                            CONCAT71(RepeatedRepetitionData.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                     (char)RepeatedRepetitionData.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage),
                            It.RS._0_8_ + 1);
          }
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8))();
          }
          if (gtest_ar_._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_._0_8_);
          }
          goto LAB_001d1699;
        }
      }
      pRVar9 = pRVar9 + 1;
    } while (pRVar9 != pRVar2);
  }
LAB_001d1699:
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)&It.MinLength);
  llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode>::~SpecificBumpPtrAllocator(local_198);
  llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeInternalNode>::~SpecificBumpPtrAllocator
            ((SpecificBumpPtrAllocator<wasm::SuffixTreeInternalNode> *)auStack_200);
  if (pvStack_218 != (void *)0x0) {
    operator_delete(pvStack_218,0x100000001 - (long)pvStack_218);
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,(long)RepeatedRepetitionData.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)local_c8);
  }
  return;
}

Assistant:

TEST(SuffixTreeTest, TestSingleCharacterRepeat) {
  std::vector<unsigned> RepeatedRepetitionData = {1, 1, 1, 1, 1, 1, 2};
  std::vector<unsigned>::iterator RRDIt, RRDIt2;
  SuffixTree ST(RepeatedRepetitionData);
  std::vector<SuffixTree::RepeatedSubstring> SubStrings;
  for (auto It = ST.begin(); It != ST.end(); It++)
    SubStrings.push_back(*It);
  EXPECT_EQ(SubStrings.size(), 1u);
  for (SuffixTree::RepeatedSubstring& RS : SubStrings) {
    EXPECT_EQ(RS.StartIndices.size(),
              RepeatedRepetitionData.size() - RS.Length);
    for (unsigned StartIdx : SubStrings[0].StartIndices) {
      RRDIt = RRDIt2 = RepeatedRepetitionData.begin();
      std::advance(RRDIt, StartIdx);
      std::advance(RRDIt2, StartIdx + SubStrings[0].Length);
      ASSERT_TRUE(
        all_of(make_range<std::vector<unsigned>::iterator>(RRDIt, RRDIt2),
               [](unsigned Elt) { return Elt == 1; }));
    }
  }
}